

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

void __thiscall duckdb::QueryProfiler::Render(QueryProfiler *this,ProfilingNode *node,ostream *ss)

{
  TextTreeRenderer local_88;
  
  local_88.config._37_3_ = 0;
  local_88.config._33_4_ = 0;
  local_88.super_TreeRenderer._vptr_TreeRenderer = (_func_int **)&PTR__TreeRenderer_0244cf58;
  local_88.config.maximum_render_width = 0xf0;
  local_88.config.node_render_width = 0x1d;
  local_88.config.minimum_render_width = 0xf;
  local_88.config.LTCORNER = anon_var_dwarf_2c1087b;
  local_88.config.RTCORNER = anon_var_dwarf_2c10886;
  local_88.config.LDCORNER = anon_var_dwarf_2c10891;
  local_88.config.RDCORNER = anon_var_dwarf_2c1089c;
  local_88.config.MIDDLE = anon_var_dwarf_2c108a7;
  local_88.config.TMIDDLE = anon_var_dwarf_2c108b2;
  local_88.config.LMIDDLE = anon_var_dwarf_2c108bd;
  local_88.config.RMIDDLE = anon_var_dwarf_2c108c8;
  local_88.config.DMIDDLE = anon_var_dwarf_2c108d3;
  local_88.config.VERTICAL = anon_var_dwarf_3f99faa + 3;
  local_88.config.HORIZONTAL = anon_var_dwarf_2c108e9;
  if ((this->is_explain_analyze == false) &&
     ((this->context->config).enable_detailed_profiling != false)) {
    local_88.config.detailed = true;
    local_88.config.max_extra_lines = 1000;
  }
  else {
    local_88.config.max_extra_lines = 0x1e;
    local_88.config.detailed = false;
  }
  TextTreeRenderer::Render(&local_88,node,ss);
  return;
}

Assistant:

void QueryProfiler::Render(const ProfilingNode &node, std::ostream &ss) const {
	TextTreeRenderer renderer;
	if (IsDetailedEnabled()) {
		renderer.EnableDetailed();
	} else {
		renderer.EnableStandard();
	}
	renderer.Render(node, ss);
}